

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int sasl_response_set_response(SASL_RESPONSE_HANDLE sasl_response,amqp_binary response_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  amqp_binary value;
  AMQP_VALUE response_amqp_value;
  SASL_RESPONSE_INSTANCE *sasl_response_instance;
  int result;
  SASL_RESPONSE_HANDLE sasl_response_local;
  amqp_binary response_value_local;
  
  if (sasl_response == (SASL_RESPONSE_HANDLE)0x0) {
    sasl_response_instance._4_4_ = 0x2ce7;
  }
  else {
    value._12_4_ = 0;
    value.bytes = (void *)SUB128(response_value._0_12_,0);
    value.length = SUB124(response_value._0_12_,8);
    item_value = amqpvalue_create_binary(value);
    if (item_value == (AMQP_VALUE)0x0) {
      sasl_response_instance._4_4_ = 0x2cef;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(sasl_response->composite_value,0,item_value);
      if (iVar1 == 0) {
        sasl_response_instance._4_4_ = 0;
      }
      else {
        sasl_response_instance._4_4_ = 0x2cf5;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return sasl_response_instance._4_4_;
}

Assistant:

int sasl_response_set_response(SASL_RESPONSE_HANDLE sasl_response, amqp_binary response_value)
{
    int result;

    if (sasl_response == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SASL_RESPONSE_INSTANCE* sasl_response_instance = (SASL_RESPONSE_INSTANCE*)sasl_response;
        AMQP_VALUE response_amqp_value = amqpvalue_create_binary(response_value);
        if (response_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(sasl_response_instance->composite_value, 0, response_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(response_amqp_value);
        }
    }

    return result;
}